

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O1

Error __thiscall asmjit::BaseEmitter::emitEpilog(BaseEmitter *this,FuncFrame *frame)

{
  Error EVar1;
  EmitHelper emitHelper;
  
  if (this->_code == (CodeHolder *)0x0) {
    EVar1 = 5;
  }
  else {
    if ((this->_environment)._arch - 1 < 2) {
      emitHelper.super_BaseEmitHelper._vptr_BaseEmitHelper = (_func_int **)&PTR_emitRegMove_00159c38
      ;
      emitHelper._16_8_ =
           CONCAT62(emitHelper._18_6_,
                    CONCAT11((char)(frame->_attributes >> 0x11),(frame->_attributes & 0x30000) != 0)
                   ) & 0xffffffffffff01ff;
      emitHelper.super_BaseEmitHelper._emitter = this;
      EVar1 = x86::EmitHelper::emitEpilog(&emitHelper,frame);
      return EVar1;
    }
    EVar1 = 4;
  }
  return EVar1;
}

Assistant:

ASMJIT_FAVOR_SIZE Error BaseEmitter::emitEpilog(const FuncFrame& frame) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

#if !defined(ASMJIT_NO_X86)
  if (environment().isFamilyX86()) {
    x86::EmitHelper emitHelper(this, frame.isAvxEnabled(), frame.isAvx512Enabled());
    return emitHelper.emitEpilog(frame);
  }
#endif

#ifdef ASMJIT_BUILD_ARM
  if (environment().isArchAArch64()) {
    a64::EmitHelper emitHelper(this);
    return emitHelper.emitEpilog(frame);
  }
#endif

  return DebugUtils::errored(kErrorInvalidArch);
}